

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelperFunctions.cpp
# Opt level: O1

void dgrminer::printOutEdges
               (vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *edge_list)

{
  ostream *poVar1;
  ulong uVar2;
  long lVar3;
  int j;
  long lVar4;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"PRINTING EDGE LIST - START",0x1a);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  if ((edge_list->super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
      )._M_impl.super__Vector_impl_data._M_finish !=
      (edge_list->super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    lVar3 = 0;
    uVar2 = 0;
    do {
      lVar4 = 0;
      do {
        poVar1 = (ostream *)
                 std::ostream::operator<<
                           ((ostream *)&std::cout,
                            *(int *)((long)((edge_list->
                                            super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start)->_M_elems +
                                    lVar4 * 4 + lVar3));
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
        lVar4 = lVar4 + 1;
      } while (lVar4 != 10);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
      std::ostream::put(-0x58);
      std::ostream::flush();
      uVar2 = uVar2 + 1;
      lVar3 = lVar3 + 0x28;
    } while (uVar2 < (ulong)(((long)(edge_list->
                                    super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(edge_list->
                                    super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start >> 3) *
                            -0x3333333333333333));
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"PRINTING EDGE LIST - START",0x1a);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  return;
}

Assistant:

void printOutEdges(std::vector<std::array<int, 10>> &edge_list)
    {

        std::cout << "PRINTING EDGE LIST - START" << std::endl;
        for (size_t i = 0; i < edge_list.size(); i++)
        {

            for (int j = 0; j < 10; j++)
            {
                std::cout << edge_list[i][j] << ", ";
            }
            std::cout << std::endl;
        }
        std::cout << "PRINTING EDGE LIST - START" << std::endl;
    }